

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

bool __thiscall
Jupiter::Database::create_database(Database *this,string_view file,DataBuffer *header)

{
  bool bVar1;
  char *file_00;
  
  file_00 = (char *)operator_new__((ulong)((long)&this->_vptr_Database + 1));
  memcpy(file_00,(void *)file._M_len,(size_t)this);
  file_00[(long)this] = '\0';
  bVar1 = create_database(file_00,(DataBuffer *)file._M_str);
  operator_delete__(file_00);
  return bVar1;
}

Assistant:

bool Jupiter::Database::create_database(std::string_view file, const Jupiter::DataBuffer *header)
{
	char *str = new char[file.size() + 1];
	memcpy(str, file.data(), file.size() * sizeof(char));
	str[file.size()] = '\0';
	bool r = Jupiter::Database::create_database(str, header);
	delete[] str;
	return r;
}